

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_memory_buffer<char,_250UL,_std::allocator<char>_> * __thiscall
fmt::v7::basic_memory_buffer<char,_250UL,_std::allocator<char>_>::operator=
          (basic_memory_buffer<char,_250UL,_std::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_std::allocator<char>_> *other)

{
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_RDI;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000018;
  basic_memory_buffer<char,_250UL,_std::allocator<char>_> *in_stack_00000020;
  
  deallocate(other);
  move(in_stack_00000020,in_stack_00000018);
  return in_RDI;
}

Assistant:

basic_memory_buffer& operator=(basic_memory_buffer&& other) FMT_NOEXCEPT {
    FMT_ASSERT(this != &other, "");
    deallocate();
    move(other);
    return *this;
  }